

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O0

string * __thiscall OB::Parg::help_abi_cxx11_(string *__return_storage_ptr__,Parg *this)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  reference piVar4;
  string local_540 [32];
  stringstream local_520 [8];
  stringstream ss_1;
  ostream local_510 [376];
  reference local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  info_pair *e;
  const_iterator __end3;
  const_iterator __begin3;
  vector<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_> *__range3;
  stringstream local_338 [8];
  stringstream ss;
  stringstream local_1a0 [8];
  stringstream out;
  ostream local_190 [376];
  Parg *local_18;
  Parg *this_local;
  
  local_18 = this;
  this_local = (Parg *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<(local_190,(string *)&this->name_);
    poVar3 = std::operator<<(poVar3,":");
    std::operator<<(poVar3,"\n");
    std::__cxx11::stringstream::stringstream(local_338);
    poVar3 = std::operator<<(local_190,"  ");
    poVar3 = std::operator<<(poVar3,(string *)&this->description_);
    std::operator<<(poVar3,"\n");
    std::__cxx11::stringstream::str();
    poVar3 = std::operator<<(local_190,(string *)&__range3);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&__range3);
    std::__cxx11::stringstream::~stringstream(local_338);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<(local_190,"Usage: ");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,(string *)&this->usage_);
    std::operator<<(poVar3,"\n");
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<(local_190,"Flags: ");
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,(string *)&this->modes_);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<(local_190,"\nOptions: ");
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,(string *)&this->options_);
  }
  bVar1 = std::vector<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_>::empty
                    (&this->info_);
  if (!bVar1) {
    __end3 = std::vector<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_>::begin
                       (&this->info_);
    e = (info_pair *)
        std::vector<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_>::end(&this->info_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_OB::Parg::info_pair_*,_std::vector<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_>_>
                                       *)&e), bVar1) {
      piVar4 = __gnu_cxx::
               __normal_iterator<const_OB::Parg::info_pair_*,_std::vector<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_>_>
               ::operator*(&__end3);
      poVar3 = std::operator<<(local_190,"\n");
      poVar3 = std::operator<<(poVar3,(string *)piVar4);
      poVar3 = std::operator<<(poVar3,":");
      std::operator<<(poVar3,"\n");
      __end4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&piVar4->text);
      t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&piVar4->text);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&t), bVar1) {
        local_398 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end4);
        poVar3 = std::operator<<(local_190,"  ");
        poVar3 = std::operator<<(poVar3,(string *)local_398);
        std::operator<<(poVar3,"\n");
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end4);
      }
      __gnu_cxx::
      __normal_iterator<const_OB::Parg::info_pair_*,_std::vector<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_>_>
      ::operator++(&__end3);
    }
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<(local_190,"\nAuthor: ");
    std::operator<<(poVar3,"\n");
    std::__cxx11::stringstream::stringstream(local_520);
    poVar3 = std::operator<<(local_510,"  ");
    poVar3 = std::operator<<(poVar3,(string *)&this->author_);
    std::operator<<(poVar3,"\n");
    std::__cxx11::stringstream::str();
    std::operator<<(local_190,local_540);
    std::__cxx11::string::~string(local_540);
    std::__cxx11::stringstream::~stringstream(local_520);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string help() const
  {
    std::stringstream out;
    if (! description_.empty())
    {
      out << name_ << ":" << "\n";
      std::stringstream ss;
      out << "  " << description_ << "\n";
      out << ss.str() << "\n";
    }

    if (! usage_.empty())
    {
      out << "Usage: " << "\n"
        << usage_ << "\n";
    }

    if (! modes_.empty())
    {
      out << "Flags: " << "\n"
        << modes_;
    }

    if (! options_.empty())
    {
      out << "\nOptions: " << "\n"
        << options_;
    }

    if (! info_.empty())
    {
      for (auto const& e : info_)
      {
        out << "\n" << e.title << ":" << "\n";

        for (auto const& t : e.text)
        {
          out << "  " << t << "\n";
        }
      }
    }

    if (! author_.empty())
    {
      out << "\nAuthor: " << "\n";
      std::stringstream ss;
      ss << "  " << author_ << "\n";
      out << ss.str();
    }

    return out.str();
  }